

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.h
# Opt level: O2

void __thiscall spvtools::opt::SSARewriter::SSARewriter(SSARewriter *this,MemPass *pass)

{
  (this->defs_at_block_)._M_h._M_buckets = &(this->defs_at_block_)._M_h._M_single_bucket;
  (this->defs_at_block_)._M_h._M_bucket_count = 1;
  (this->defs_at_block_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->defs_at_block_)._M_h._M_element_count = 0;
  (this->defs_at_block_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->defs_at_block_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->defs_at_block_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->phi_candidates_)._M_h._M_buckets = &(this->phi_candidates_)._M_h._M_single_bucket;
  (this->phi_candidates_)._M_h._M_bucket_count = 1;
  (this->phi_candidates_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->phi_candidates_)._M_h._M_element_count = 0;
  (this->phi_candidates_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->phi_candidates_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->phi_candidates_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  queue<spvtools::opt::SSARewriter::PhiCandidate*,std::deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>>
  ::
  queue<std::deque<spvtools::opt::SSARewriter::PhiCandidate*,std::allocator<spvtools::opt::SSARewriter::PhiCandidate*>>,void>
            (&this->incomplete_phis_);
  (this->phis_to_generate_).
  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->phis_to_generate_).
  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->phis_to_generate_).
  super__Vector_base<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->load_replacement_)._M_h._M_buckets = &(this->load_replacement_)._M_h._M_single_bucket;
  (this->load_replacement_)._M_h._M_bucket_count = 1;
  (this->load_replacement_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->load_replacement_)._M_h._M_element_count = 0;
  (this->load_replacement_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->load_replacement_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->load_replacement_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->sealed_blocks_)._M_h._M_buckets = &(this->sealed_blocks_)._M_h._M_single_bucket;
  (this->sealed_blocks_)._M_h._M_bucket_count = 1;
  (this->sealed_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sealed_blocks_)._M_h._M_element_count = 0;
  (this->sealed_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sealed_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sealed_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->pass_ = pass;
  return;
}

Assistant:

SSARewriter(MemPass* pass) : pass_(pass) {}